

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

int UnityIsOneArrayNull(void *expected,void *actual,UNITY_UINT lineNumber,char *msg)

{
  int iVar1;
  char *string;
  
  iVar1 = 0;
  if (expected != actual) {
    if (expected == (void *)0x0) {
      string = " Expected pointer to be NULL";
    }
    else {
      if (actual != (void *)0x0) {
        return 0;
      }
      string = " Actual pointer was NULL";
    }
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(string);
    UnityAddMsgIfSpecified(msg);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int UnityIsOneArrayNull(UNITY_INTERNAL_PTR expected,
                               UNITY_INTERNAL_PTR actual,
                               const UNITY_LINE_TYPE lineNumber,
                               const char* msg)
{
    if (expected == actual) return 0; /* Both are NULL or same pointer */

    /* print and return true if just expected is NULL */
    if (expected == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForExpected);
        UnityAddMsgIfSpecified(msg);
        return 1;
    }

    /* print and return true if just actual is NULL */
    if (actual == NULL)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrNullPointerForActual);
        UnityAddMsgIfSpecified(msg);
        return 1;
    }

    return 0; /* return false if neither is NULL */
}